

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::MultiTextureSamplerTest::renderResults
          (MultiTextureSamplerTest *this,Surface *textureResult,Surface *samplerResult,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  undefined4 extraout_var;
  TestError *this_00;
  PixelBufferAccess local_f8;
  PixelBufferAccess local_d0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  GLfloat local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  GLfloat local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  GLfloat local_50;
  GLuint local_3c;
  GLuint local_38;
  GLuint sampler;
  GLuint texture2;
  GLuint texture1;
  Functions *gl;
  int y_local;
  int x_local;
  Surface *samplerResult_local;
  Surface *textureResult_local;
  MultiTextureSamplerTest *this_local;
  
  gl._0_4_ = y;
  gl._4_4_ = x;
  _y_local = samplerResult;
  samplerResult_local = textureResult;
  textureResult_local = (Surface *)this;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  _texture2 = (Functions *)CONCAT44(extraout_var,iVar4);
  sampler = createTexture(_texture2,this->m_target,0);
  local_38 = createTexture(_texture2,this->m_target,1);
  local_3c = 0xffffffff;
  (*_texture2->viewport)(gl._4_4_,(int)gl,0x80,0x80);
  GVar5 = (*_texture2->getError)();
  glu::checkError(GVar5,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x438);
  (*_texture2->genSamplers)(1,&local_3c);
  GVar5 = (*_texture2->getError)();
  glu::checkError(GVar5,"glGenSamplers(1, &sampler)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x43b);
  while( true ) {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || (local_3c == 0xffffffff)) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      (*_texture2->bindSampler)(0,local_3c);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindSampler(0, sampler)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x43f);
      (*_texture2->bindSampler)(1,local_3c);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindSampler(1, sampler)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x441);
      pSVar1 = &this->m_samplerState;
      local_68._0_4_ = pSVar1->minFilter;
      local_68._4_4_ = pSVar1->magFilter;
      local_60._0_4_ = (this->m_samplerState).wrapT;
      local_60._4_4_ = (this->m_samplerState).wrapS;
      local_58._0_4_ = (this->m_samplerState).wrapR;
      local_58._4_4_ = (this->m_samplerState).minLod;
      local_50 = (this->m_samplerState).maxLod;
      setSamplerState(_texture2,*pSVar1,local_3c);
      (*_texture2->bindTexture)(this->m_target,sampler);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, texture1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x448);
      pSVar1 = &this->m_textureState1;
      local_88._0_4_ = pSVar1->minFilter;
      local_88._4_4_ = pSVar1->magFilter;
      local_80._0_4_ = (this->m_textureState1).wrapT;
      local_80._4_4_ = (this->m_textureState1).wrapS;
      local_78._0_4_ = (this->m_textureState1).wrapR;
      local_78._4_4_ = (this->m_textureState1).minLod;
      local_70 = (this->m_textureState1).maxLod;
      setTextureState(_texture2,this->m_target,*pSVar1);
      (*_texture2->bindTexture)(this->m_target,local_38);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, texture2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x44c);
      pSVar1 = &this->m_textureState2;
      local_a8._0_4_ = pSVar1->minFilter;
      local_a8._4_4_ = pSVar1->magFilter;
      local_a0._0_4_ = (this->m_textureState2).wrapT;
      local_a0._4_4_ = (this->m_textureState2).wrapS;
      local_98._0_4_ = (this->m_textureState2).wrapR;
      local_98._4_4_ = (this->m_textureState2).minLod;
      local_90 = (this->m_textureState2).maxLod;
      setTextureState(_texture2,this->m_target,*pSVar1);
      (*_texture2->activeTexture)(0x84c0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x450);
      (*_texture2->bindTexture)(this->m_target,sampler);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, texture1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x452);
      (*_texture2->activeTexture)(0x84c1);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x455);
      (*_texture2->bindTexture)(this->m_target,local_38);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, texture2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x457);
      render(this);
      iVar3 = gl._4_4_;
      iVar4 = (int)gl;
      pRVar2 = this->m_renderCtx;
      tcu::Surface::getAccess(&local_d0,_y_local);
      glu::readPixels(pRVar2,iVar3,iVar4,&local_d0);
      (*_texture2->bindSampler)(0,0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindSampler(0, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x45e);
      (*_texture2->bindSampler)(1,0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindSampler(1, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x460);
      render(this);
      iVar3 = gl._4_4_;
      iVar4 = (int)gl;
      pRVar2 = this->m_renderCtx;
      tcu::Surface::getAccess(&local_f8,samplerResult_local);
      glu::readPixels(pRVar2,iVar3,iVar4,&local_f8);
      (*_texture2->activeTexture)(0x84c0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x466);
      (*_texture2->bindTexture)(this->m_target,0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x468);
      (*_texture2->activeTexture)(0x84c1);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glActiveTexture(GL_TEXTURE1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x46b);
      (*_texture2->bindTexture)(this->m_target,0);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glBindTexture(m_target, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x46d);
      (*_texture2->deleteSamplers)(1,&local_3c);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glDeleteSamplers(1, &sampler)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x470);
      (*_texture2->deleteTextures)(1,&sampler);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glDeleteTextures(1, &texture1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x472);
      (*_texture2->deleteTextures)(1,&local_38);
      GVar5 = (*_texture2->getError)();
      glu::checkError(GVar5,"glDeleteTextures(1, &texture2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x474);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"sampler != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0x43c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void MultiTextureSamplerTest::renderResults (tcu::Surface& textureResult, tcu::Surface& samplerResult, int x, int y)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	GLuint					texture1	= createTexture(gl, m_target, 0);
	GLuint					texture2	= createTexture(gl, m_target, 1);
	GLuint					sampler		= -1;

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.genSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers(1, &sampler)");
	TCU_CHECK(sampler != (GLuint)-1);

	gl.bindSampler(0, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, sampler)");
	gl.bindSampler(1, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(1, sampler)");

	// First set sampler state
	setSamplerState(gl, m_samplerState, sampler);

	// Set texture state
	gl.bindTexture(m_target, texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture1)");
	setTextureState(gl, m_target, m_textureState1);

	gl.bindTexture(m_target, texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture2)");
	setTextureState(gl, m_target, m_textureState2);

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE0)");
	gl.bindTexture(m_target, texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture1)");

	gl.activeTexture(GL_TEXTURE1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE1)");
	gl.bindTexture(m_target, texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture2)");

	// Render using sampler
	render();
	glu::readPixels(m_renderCtx, x, y, samplerResult.getAccess());

	gl.bindSampler(0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, 0)");
	gl.bindSampler(1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(1, 0)");

	render();
	glu::readPixels(m_renderCtx, x, y, textureResult.getAccess());

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE0)");
	gl.bindTexture(m_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, 0)");

	gl.activeTexture(GL_TEXTURE1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE1)");
	gl.bindTexture(m_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, 0)");

	gl.deleteSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteSamplers(1, &sampler)");
	gl.deleteTextures(1, &texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture1)");
	gl.deleteTextures(1, &texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture2)");
}